

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testlist.cpp
# Opt level: O1

void __thiscall Testlist::print(Testlist *this)

{
  long lVar1;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> list;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> local_38;
  
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::vector(&local_38,&this->_list);
  if (0 < (int)((ulong)((long)(this->_list).
                              super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->_list).
                             super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3)) {
    lVar1 = 0;
    do {
      if (lVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      }
      (**(this->_list).super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
         super__Vector_impl_data._M_start[lVar1]->_vptr_ExprNode)();
      lVar1 = lVar1 + 1;
    } while (lVar1 < (int)((ulong)((long)(this->_list).
                                         super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->_list).
                                        super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (local_38.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Testlist::print() {
    std::vector<ExprNode*>list = getTestlist();
    for(int i = 0; i < numTests();i++){
        if(i != 0)
            std::cout << ", ";
        at(i)->print();
    }
//    for (auto e: _list) {
//        e->print();
//        std::cout << ", ";
//    }
}